

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkGetNumExpSteps(void *arkode_mem,long *nsteps)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkGetNumExpSteps","arkode_mem = NULL illegal.");
  }
  else {
    *nsteps = *(long *)(*(long *)((long)arkode_mem + 0x1b0) + 0xd8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkGetNumExpSteps(void *arkode_mem, long int *nsteps)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkGetNumExpSteps", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  *nsteps = ark_mem->hadapt_mem->nst_exp;
  return(ARK_SUCCESS);
}